

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeDefUse(DefUseManager *this,Module *module)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  if (module != (Module *)0x0) {
    local_50._8_8_ = 0;
    local_50._M_unused._M_object = operator_new(0x18);
    *(code **)local_50._M_unused._0_8_ = AnalyzeInstDef;
    *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
    *(DefUseManager **)((long)local_50._M_unused._0_8_ + 0x10) = this;
    local_38 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_std::_Bind<void_(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>))(spvtools::opt::Instruction_*)>_>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_std::_Bind<void_(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>))(spvtools::opt::Instruction_*)>_>
               ::_M_manager;
    Module::ForEachInst(module,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,true);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    local_50._8_8_ = 0;
    local_50._M_unused._M_object = operator_new(0x18);
    *(code **)local_50._M_unused._0_8_ = AnalyzeInstUse;
    *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
    *(DefUseManager **)((long)local_50._M_unused._0_8_ + 0x10) = this;
    local_38 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_std::_Bind<void_(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>))(spvtools::opt::Instruction_*)>_>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_std::_Bind<void_(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>))(spvtools::opt::Instruction_*)>_>
               ::_M_manager;
    Module::ForEachInst(module,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,true);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  return;
}

Assistant:

void DefUseManager::AnalyzeDefUse(Module* module) {
  if (!module) return;
  // Analyze all the defs before any uses to catch forward references.
  module->ForEachInst(
      std::bind(&DefUseManager::AnalyzeInstDef, this, std::placeholders::_1),
      true);
  module->ForEachInst(
      std::bind(&DefUseManager::AnalyzeInstUse, this, std::placeholders::_1),
      true);
}